

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * CreateReturn(ExpressionContext *ctx,SynBase *source,ExprBase *result)

{
  bool bVar1;
  int iVar2;
  FunctionData *pFVar3;
  TypeFunction *pTVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  SynBase *pSVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeBase *pTVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TypeBase *pTVar10;
  ExprBase *pEVar6;
  
  pTVar9 = result->type;
  if ((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0)) {
    pFVar3 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    if (pFVar3 == (FunctionData *)0x0) {
      if ((pTVar9 != (TypeBase *)0x0) && (pTVar9->typeID == 0x15)) {
        result = CreateCast(ctx,source,result,pTVar9,false);
      }
      bVar1 = AssertValueExpression(ctx,result->source,result);
      if (bVar1) {
        pTVar9 = result->type;
        bVar1 = ExpressionContext::IsNumericType(ctx,pTVar9);
        if ((!bVar1) && ((pTVar9 == (TypeBase *)0x0 || (pTVar9->typeID != 0x19)))) {
          anon_unknown.dwarf_94284::Report
                    (ctx,source,"ERROR: global return cannot accept \'%.*s\'",
                     (ulong)(uint)(*(int *)&(pTVar9->name).end - (int)(pTVar9->name).begin));
        }
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
        pTVar9 = ctx->typeVoid;
        goto LAB_0014cb0c;
      }
    }
    else {
      pTVar9 = pFVar3->type->returnType;
      if (pTVar9 != ctx->typeAuto) {
LAB_0014c935:
        pTVar10 = ctx->typeVoid;
        if ((pTVar9 == ctx->typeVoid) && (pTVar10 = pTVar9, result->type != pTVar9)) {
          anon_unknown.dwarf_94284::Report(ctx,source,"ERROR: \'void\' function returning a value");
          pTVar10 = ctx->typeVoid;
        }
        if ((pTVar9 != pTVar10) && (result->type == pTVar10)) {
          anon_unknown.dwarf_94284::Report
                    (ctx,source,"ERROR: function must return a value of type \'%.*s\'",
                     (ulong)(uint)(*(int *)&(pTVar9->name).end - (int)(pTVar9->name).begin));
        }
        pEVar5 = CreateCast(ctx,source,result,pFVar3->type->returnType,false);
        pFVar3->hasExplicitReturn = true;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar2);
        pTVar9 = ctx->typeVoid;
        pEVar7 = CreateFunctionCoroutineStateUpdate(ctx,source,pFVar3,0);
        pSVar8 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pSVar8 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar8,pFVar3,ctx->scope);
        pEVar6->typeID = 0x1c;
        pEVar6->source = source;
        pEVar6->type = pTVar9;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
        pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar5;
        *(ExprBase **)&pEVar6[1].typeID = pEVar7;
        pEVar6[1].source = pSVar8;
        return pEVar6;
      }
      bVar1 = AssertValueExpression(ctx,source,result);
      if (bVar1) {
        pTVar9 = result->type;
        pTVar4 = ExpressionContext::GetFunctionType(ctx,source,pTVar9,pFVar3->type->arguments);
        pFVar3->type = pTVar4;
        goto LAB_0014c935;
      }
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
    pTVar9 = ctx->typeVoid;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pSVar8 = result->source;
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError
              ((ExprError *)CONCAT44(extraout_var_03,iVar2),pSVar8,pTVar10,result,(ExprBase *)0x0);
    pEVar5->typeID = 0x1c;
    pEVar5->source = source;
    pEVar5->type = pTVar9;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
    pEVar5[1]._vptr_ExprBase = (_func_int **)CONCAT44(extraout_var_03,iVar2);
  }
  else {
    pFVar3 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    if (pFVar3 != (FunctionData *)0x0) {
      pFVar3->hasExplicitReturn = true;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
    pTVar9 = result->type;
LAB_0014cb0c:
    pEVar5->typeID = 0x1c;
    pEVar5->source = source;
    pEVar5->type = pTVar9;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
    pEVar5[1]._vptr_ExprBase = (_func_int **)result;
  }
  *(undefined8 *)&pEVar5[1].typeID = 0;
  pEVar5[1].source = (SynBase *)0x0;
  return pEVar5;
}

Assistant:

ExprBase* CreateReturn(ExpressionContext &ctx, SynBase *source, ExprBase *result)
{
	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprReturn>()) ExprReturn(source, result->type, result, NULL, NULL);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, source, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(source, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, source, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, source, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, source, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, source, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope));
	}

	if(isType<TypeFunction>(result->type))
		result = CreateCast(ctx, source, result, result->type, false);

	if(!AssertValueExpression(ctx, result->source, result))
		return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

	if(!ctx.IsNumericType(result->type) && !isType<TypeEnum>(result->type))
		Report(ctx, source, "ERROR: global return cannot accept '%.*s'", FMT_ISTR(result->type->name));

	return new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, NULL, NULL);
}